

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O2

bool __thiscall OpenMD::Globals::addZConsStamp(Globals *this,ZConsStamp *zcons)

{
  ZConsStamp *local_8;
  
  local_8 = zcons;
  std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::push_back
            (&this->zconstraints_,&local_8);
  return true;
}

Assistant:

bool Globals::addZConsStamp(ZConsStamp* zcons) {
    zconstraints_.push_back(zcons);
    return true;
  }